

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O3

void nrg::InstantExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  _Any_data _Stack_48;
  _Manager_type local_38;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/InstantExecution.h:51:29)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/InstantExecution.h:51:29)>
             ::_M_manager;
  local_28._M_unused._M_function_pointer = fn;
  std::function<void_()>::function((function<void_()> *)&_Stack_48,(function<void_()> *)&local_28);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,
             (function<void_()> *)&_Stack_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&_Stack_48,&_Stack_48,__destroy_functor);
  }
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }